

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void al_unref_user_event(ALLEGRO_USER_EVENT *event)

{
  int iVar1;
  long in_RDI;
  int refcount;
  void *unaff_retaddr;
  ALLEGRO_USER_EVENT_DESCRIPTOR *descr;
  undefined4 in_stack_ffffffffffffffe8;
  char *file;
  
  file = *(char **)(in_RDI + 0x18);
  if (file != (char *)0x0) {
    _al_mutex_lock((_AL_MUTEX *)0x174b3b);
    iVar1 = *(int *)(file + 8) + -1;
    *(int *)(file + 8) = iVar1;
    _al_mutex_unlock((_AL_MUTEX *)0x174b59);
    if (iVar1 == 0) {
      (**(code **)file)(in_RDI);
      al_free_with_context
                (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),file,
                 (char *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

void al_unref_user_event(ALLEGRO_USER_EVENT *event)
{
   ALLEGRO_USER_EVENT_DESCRIPTOR *descr;
   int refcount;

   ASSERT(event);

   descr = event->__internal__descr;
   if (descr) {
      _al_mutex_lock(&user_event_refcount_mutex);
      ASSERT(descr->refcount > 0);
      refcount = --descr->refcount;
      _al_mutex_unlock(&user_event_refcount_mutex);

      if (refcount == 0) {
         (descr->dtor)(event);
         al_free(descr);
      }
   }
}